

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlNode * __thiscall
TiXmlNode::InsertBeforeChild(TiXmlNode *this,TiXmlNode *beforeThis,TiXmlNode *addThis)

{
  TiXmlNode *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  TiXmlDocument *pTVar4;
  TiXmlNode **ppTVar5;
  TiXmlNode *pTVar3;
  
  if ((beforeThis != (TiXmlNode *)0x0) && (beforeThis->parent == this)) {
    if (addThis->type == TINYXML_DOCUMENT) {
      pTVar4 = GetDocument(this);
      if (pTVar4 != (TiXmlDocument *)0x0) {
        pTVar4 = GetDocument(this);
        TiXmlDocument::SetError
                  (pTVar4,0xf,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
        return (TiXmlNode *)0x0;
      }
    }
    else {
      iVar2 = (*(addThis->super_TiXmlBase)._vptr_TiXmlBase[0x10])(addThis);
      pTVar3 = (TiXmlNode *)CONCAT44(extraout_var,iVar2);
      if (pTVar3 != (TiXmlNode *)0x0) {
        pTVar3->parent = this;
        pTVar3->next = beforeThis;
        pTVar1 = beforeThis->prev;
        pTVar3->prev = pTVar1;
        if (pTVar1 == (TiXmlNode *)0x0) {
          if (this->firstChild != beforeThis) {
            __assert_fail("firstChild == beforeThis",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/luckynote[P]ibug_300W_make_landmarks_tools/src/tinyXML/tinyxml.cpp"
                          ,0xff,
                          "TiXmlNode *TiXmlNode::InsertBeforeChild(TiXmlNode *, const TiXmlNode &)")
            ;
          }
          ppTVar5 = &this->firstChild;
        }
        else {
          ppTVar5 = &pTVar1->next;
        }
        *ppTVar5 = pTVar3;
        beforeThis->prev = pTVar3;
        return pTVar3;
      }
    }
  }
  return (TiXmlNode *)0x0;
}

Assistant:

TiXmlNode* TiXmlNode::InsertBeforeChild( TiXmlNode* beforeThis, const TiXmlNode& addThis )
{	
	if ( !beforeThis || beforeThis->parent != this ) {
		return 0;
	}
	if ( addThis.Type() == TiXmlNode::TINYXML_DOCUMENT )
	{
		if ( GetDocument() ) 
			GetDocument()->SetError( TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0, TIXML_ENCODING_UNKNOWN );
		return 0;
	}

	TiXmlNode* node = addThis.Clone();
	if ( !node )
		return 0;
	node->parent = this;

	node->next = beforeThis;
	node->prev = beforeThis->prev;
	if ( beforeThis->prev )
	{
		beforeThis->prev->next = node;
	}
	else
	{
		assert( firstChild == beforeThis );
		firstChild = node;
	}
	beforeThis->prev = node;
	return node;
}